

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracer.cpp
# Opt level: O0

void __thiscall
PathTracer::create_target_images
          (PathTracer *this,shared_ptr<myvk::Device> *device,
          vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
          *access_queue)

{
  shared_ptr<myvk::Image> *in_RDX;
  long in_RDI;
  shared_ptr<myvk::Image> *__r;
  shared_ptr<myvk::Image> *in_stack_fffffffffffffed0;
  shared_ptr<myvk::ImageBase> *this_00;
  undefined1 *puVar1;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 uVar2;
  VkImageUsageFlags in_stack_ffffffffffffff44;
  VkFormat in_stack_ffffffffffffff48;
  uint32_t in_stack_ffffffffffffff4c;
  VkExtent2D *in_stack_ffffffffffffff50;
  Ptr<Device> *in_stack_ffffffffffffff58;
  shared_ptr<myvk::ImageBase> local_a0;
  vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
  *in_stack_ffffffffffffff70;
  undefined1 local_80 [32];
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_30;
  undefined4 local_2c;
  shared_ptr<myvk::Image> *local_18;
  
  local_30 = *(undefined4 *)(in_RDI + 0x1a8);
  local_2c = *(undefined4 *)(in_RDI + 0x1ac);
  uVar2 = 1;
  local_18 = in_RDX;
  myvk::Image::CreateTexture2D
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
             in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff70);
  std::shared_ptr<myvk::Image>::operator=(in_stack_fffffffffffffed0,in_RDX);
  std::shared_ptr<myvk::Image>::~shared_ptr((shared_ptr<myvk::Image> *)0x16e675);
  local_48 = *(undefined4 *)(in_RDI + 0x1a8);
  local_44 = *(undefined4 *)(in_RDI + 0x1ac);
  __r = local_18;
  myvk::Image::CreateTexture2D
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
             in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff70);
  std::shared_ptr<myvk::Image>::operator=(in_stack_fffffffffffffed0,__r);
  std::shared_ptr<myvk::Image>::~shared_ptr((shared_ptr<myvk::Image> *)0x16e6f3);
  local_60 = *(undefined4 *)(in_RDI + 0x1a8);
  local_5c = *(undefined4 *)(in_RDI + 0x1ac);
  myvk::Image::CreateTexture2D
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
             in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff70);
  std::shared_ptr<myvk::Image>::operator=(in_stack_fffffffffffffed0,local_18);
  std::shared_ptr<myvk::Image>::~shared_ptr((shared_ptr<myvk::Image> *)0x16e771);
  puVar1 = local_80;
  std::shared_ptr<myvk::ImageBase>::shared_ptr<myvk::Image,void>
            ((shared_ptr<myvk::ImageBase> *)in_stack_fffffffffffffed0,local_18);
  myvk::ImageView::Create
            ((Ptr<ImageBase> *)CONCAT44(uVar2,in_stack_ffffffffffffff28),
             (VkImageViewType)((ulong)puVar1 >> 0x20),(VkImageAspectFlags)puVar1);
  std::shared_ptr<myvk::ImageView>::operator=
            ((shared_ptr<myvk::ImageView> *)in_stack_fffffffffffffed0,
             (shared_ptr<myvk::ImageView> *)local_18);
  std::shared_ptr<myvk::ImageView>::~shared_ptr((shared_ptr<myvk::ImageView> *)0x16e7ca);
  std::shared_ptr<myvk::ImageBase>::~shared_ptr((shared_ptr<myvk::ImageBase> *)0x16e7d7);
  std::shared_ptr<myvk::ImageBase>::shared_ptr<myvk::Image,void>
            ((shared_ptr<myvk::ImageBase> *)in_stack_fffffffffffffed0,local_18);
  myvk::ImageView::Create
            ((Ptr<ImageBase> *)CONCAT44(uVar2,in_stack_ffffffffffffff28),
             (VkImageViewType)((ulong)puVar1 >> 0x20),(VkImageAspectFlags)puVar1);
  this_00 = &local_a0;
  std::shared_ptr<myvk::ImageView>::operator=
            ((shared_ptr<myvk::ImageView> *)this_00,(shared_ptr<myvk::ImageView> *)local_18);
  std::shared_ptr<myvk::ImageView>::~shared_ptr((shared_ptr<myvk::ImageView> *)0x16e838);
  std::shared_ptr<myvk::ImageBase>::~shared_ptr((shared_ptr<myvk::ImageBase> *)0x16e845);
  std::shared_ptr<myvk::ImageBase>::shared_ptr<myvk::Image,void>(this_00,local_18);
  myvk::ImageView::Create
            ((Ptr<ImageBase> *)CONCAT44(uVar2,in_stack_ffffffffffffff28),
             (VkImageViewType)((ulong)puVar1 >> 0x20),(VkImageAspectFlags)puVar1);
  std::shared_ptr<myvk::ImageView>::operator=
            ((shared_ptr<myvk::ImageView> *)this_00,(shared_ptr<myvk::ImageView> *)local_18);
  std::shared_ptr<myvk::ImageView>::~shared_ptr((shared_ptr<myvk::ImageView> *)0x16e898);
  std::shared_ptr<myvk::ImageBase>::~shared_ptr((shared_ptr<myvk::ImageBase> *)0x16e8a2);
  return;
}

Assistant:

void PathTracer::create_target_images(const std::shared_ptr<myvk::Device> &device,
                                      const std::vector<std::shared_ptr<myvk::Queue>> &access_queue) {
	m_color_image = myvk::Image::CreateTexture2D(
	    device, {m_width, m_height}, 1, VK_FORMAT_R32G32B32A32_SFLOAT,
	    VK_IMAGE_USAGE_TRANSFER_DST_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_STORAGE_BIT, access_queue);
	m_albedo_image = myvk::Image::CreateTexture2D(
	    device, {m_width, m_height}, 1, VK_FORMAT_R8G8B8A8_UNORM,
	    VK_IMAGE_USAGE_TRANSFER_DST_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_STORAGE_BIT, access_queue);
	m_normal_image = myvk::Image::CreateTexture2D(
	    device, {m_width, m_height}, 1, VK_FORMAT_R8G8B8A8_SNORM,
	    VK_IMAGE_USAGE_TRANSFER_DST_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_STORAGE_BIT, access_queue);

	m_color_image_view = myvk::ImageView::Create(m_color_image, VK_IMAGE_VIEW_TYPE_2D);
	m_albedo_image_view = myvk::ImageView::Create(m_albedo_image, VK_IMAGE_VIEW_TYPE_2D);
	m_normal_image_view = myvk::ImageView::Create(m_normal_image, VK_IMAGE_VIEW_TYPE_2D);
}